

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteReg4U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,uint index)

{
  bool bVar1;
  undefined2 local_1a;
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (local_1a = (undefined2)R0, R0 < 0x10000)) &&
      (local_18 = (undefined2)R1, R1 < 0x10000)) &&
     (((local_16 = (undefined2)R2, R2 < 0x10000 && (local_14 = (undefined2)R3, R3 < 0x10000)) &&
      (layout.R0 = (RegSlotType)index, index < 0x10000)))) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_1a,10);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg4U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, uint index)
    {
        OpLayoutT_Reg4U<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2)
            && SizePolicy::Assign(layout.R3, R3) && SizePolicy::Assign(layout.SlotIndex, index))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }